

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

void LTACMasterdataChannel::UnregisterMasterDataChn(LTACMasterdataChannel *pChn)

{
  int iVar1;
  char local_10 [8];
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mtxMaster);
  if (iVar1 == 0) {
    std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::remove
              (&lstChn_abi_cxx11_,local_10);
    pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void LTACMasterdataChannel::UnregisterMasterDataChn (LTACMasterdataChannel* pChn)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        // just remove the channel
        lstChn.remove(pChn);
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
}